

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::write<char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,char value,format_specs *specs,locale_ref loc)

{
  loc_value value_00;
  bool bVar1;
  uint uVar2;
  basic_appender<char> bVar3;
  undefined4 uStack_44;
  undefined8 uStack_40;
  undefined4 uStack_34;
  undefined8 uStack_30;
  
  bVar1 = check_char_specs(specs);
  if (bVar1) {
    bVar3 = write_char<char,fmt::v11::basic_appender<char>>(out,value,specs);
    return (basic_appender<char>)bVar3.container;
  }
  uVar2 = (specs->super_basic_specs).data_;
  if ((uVar2 >> 0xe & 1) != 0) {
    value_00.value_.value_.field_0.int_value._1_3_ = 0;
    value_00.value_.value_.field_0.char_value = value;
    value_00.value_.value_.field_0.long_long_value._4_4_ = uStack_44;
    value_00.value_._20_4_ = uStack_34;
    value_00.value_.type_ = 2;
    value_00.value_.value_.field_0.string.size = uStack_40;
    value_00.value_._24_8_ = uStack_30;
    bVar1 = write_loc((appender)out.container,value_00,specs,loc);
    if (bVar1) {
      return (basic_appender<char>)out.container;
    }
    uVar2 = (specs->super_basic_specs).data_;
  }
  bVar3 = write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_int>
                    (out,(write_int_arg<unsigned_int>)
                         ((ulong)(byte)value |
                         (ulong)*(uint *)((long)&DAT_001836d0 + (ulong)(uVar2 >> 8 & 0xc)) << 0x20),
                     specs);
  return (basic_appender<char>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value, const format_specs& specs,
                         locale_ref loc = {}) -> OutputIt {
  // char is formatted as unsigned char for consistency across platforms.
  using unsigned_type =
      conditional_t<std::is_same<Char, char>::value, unsigned char, unsigned>;
  return check_char_specs(specs)
             ? write_char<Char>(out, value, specs)
             : write<Char>(out, static_cast<unsigned_type>(value), specs, loc);
}